

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.cpp
# Opt level: O2

int __thiscall jrtplib::RTPPacketBuilder::AddCSRC(RTPPacketBuilder *this,uint32_t csrc)

{
  uint32_t *puVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (this->init == true) {
    uVar2 = this->numcsrcs;
    if ((long)(int)uVar2 < 0xf) {
      uVar4 = 0;
      uVar5 = 0;
      if (0 < (int)uVar2) {
        uVar5 = (ulong)uVar2;
      }
      do {
        if (uVar5 == uVar4) {
          this->csrcs[(int)uVar2] = csrc;
          this->numcsrcs = this->numcsrcs + 1;
          return 0;
        }
        puVar1 = this->csrcs + uVar4;
        uVar4 = uVar4 + 1;
      } while (*puVar1 != csrc);
      return -0xd;
    }
    iVar3 = -0xe;
  }
  else {
    iVar3 = -0x14;
  }
  return iVar3;
}

Assistant:

int RTPPacketBuilder::AddCSRC(uint32_t csrc)
{
	if (!init)
		return ERR_RTP_PACKBUILD_NOTINIT;
	if (numcsrcs >= RTP_MAXCSRCS)
		return ERR_RTP_PACKBUILD_CSRCLISTFULL;

	int i;
	
	for (i = 0 ; i < numcsrcs ; i++)
	{
		if (csrcs[i] == csrc)
			return ERR_RTP_PACKBUILD_CSRCALREADYINLIST;
	}
	csrcs[numcsrcs] = csrc;
	numcsrcs++;
	return 0;
}